

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::HasLazyFields(FileDescriptor *file,Options *options)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Descriptor *in_RSI;
  FileDescriptor *in_RDI;
  int field_idx;
  Descriptor *descriptor;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  
  iVar5 = 0;
  while( true ) {
    iVar4 = iVar5;
    iVar2 = FileDescriptor::message_type_count(in_RDI);
    if (iVar2 <= iVar5) {
      iVar4 = 0;
      while( true ) {
        iVar2 = iVar4;
        iVar3 = FileDescriptor::extension_count(in_RDI);
        if (iVar3 <= iVar4) {
          return false;
        }
        FileDescriptor::extension(in_RDI,iVar2);
        bVar1 = IsLazy((FieldDescriptor *)CONCAT44(iVar2,iVar5),
                       (Options *)CONCAT44(iVar4,in_stack_ffffffffffffffc8));
        if (bVar1) break;
        iVar4 = iVar2 + 1;
      }
      return true;
    }
    FileDescriptor::message_type(in_RDI,iVar4);
    bVar1 = HasLazyFields(in_RSI,(Options *)CONCAT44(iVar4,in_stack_ffffffffffffffe0));
    if (bVar1) break;
    iVar5 = iVar4 + 1;
  }
  return true;
}

Assistant:

bool HasLazyFields(const FileDescriptor* file, const Options& options) {
  for (int i = 0; i < file->message_type_count(); i++) {
    const Descriptor* descriptor(file->message_type(i));
    if (HasLazyFields(descriptor, options)) {
      return true;
    }
  }
  for (int field_idx = 0; field_idx < file->extension_count(); field_idx++) {
    if (IsLazy(file->extension(field_idx), options)) {
      return true;
    }
  }
  return false;
}